

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O2

void ArrayDelete<aiCamera>(aiCamera ***in,uint *num)

{
  aiCamera **ppaVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; ppaVar1 = *in, uVar2 < *num; uVar2 = uVar2 + 1) {
    operator_delete(ppaVar1[uVar2],0x438);
  }
  if (ppaVar1 != (aiCamera **)0x0) {
    operator_delete__(ppaVar1);
  }
  *in = (aiCamera **)0x0;
  *num = 0;
  return;
}

Assistant:

inline void ArrayDelete(T**& in, unsigned int& num)
{
    for (unsigned int i = 0; i < num; ++i)
        delete in[i];

    delete[] in;
    in = NULL;
    num = 0;
}